

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O0

void __thiscall HDual::major_updateFtranPrepare(HDual *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double in_RDI;
  HVector *unaff_retaddr;
  HVector *iColumn;
  MFinish *iFinish;
  double in_stack_00000018;
  int iFn_1;
  int iRow;
  int k;
  double pivotX;
  double *jRow_epArray;
  MFinish *jFinish;
  int jFn;
  HVector *Vec;
  MFinish *Fin;
  int iFn;
  int local_4c;
  int local_44;
  HVector *in_stack_ffffffffffffffc0;
  int local_24;
  undefined4 in_stack_fffffffffffffff0;
  int iVar7;
  double pivotX_00;
  
  pivotX_00 = in_RDI;
  HVector::clear(in_stack_ffffffffffffffc0);
  for (iVar7 = 0; iVar7 < *(int *)((long)in_RDI + 0xefe8); iVar7 = iVar7 + 1) {
    lVar2 = *(long *)((long)in_RDI + (long)iVar7 * 0x78 + 81000);
    HMatrix::collect_aj((HMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
    local_24 = iVar7;
    while (local_24 = local_24 + -1, -1 < local_24) {
      lVar3 = (long)in_RDI + 0x13bf8 + (long)local_24 * 0x78;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(lVar3 + 0x60) + 0x20),0);
      in_stack_ffffffffffffffc0 = (HVector *)0x0;
      for (local_44 = 0; local_44 < *(int *)(lVar2 + 4); local_44 = local_44 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(lVar2 + 8),(long)local_44);
        iVar1 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x20),(long)iVar1);
        in_stack_ffffffffffffffc0 =
             (HVector *)(*pvVar6 * pvVar4[iVar1] + (double)in_stack_ffffffffffffffc0);
      }
      if (1e-14 < ABS((double)in_stack_ffffffffffffffc0)) {
        in_stack_ffffffffffffffc0 =
             (HVector *)((double)in_stack_ffffffffffffffc0 / *(double *)(lVar3 + 0x38));
        HMatrix::collect_aj((HMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
        HMatrix::collect_aj((HMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
      }
    }
    HVector::saxpy(unaff_retaddr,pivotX_00,(HVector *)CONCAT44(iVar7,in_stack_fffffffffffffff0));
  }
  for (local_4c = 0; local_4c < *(int *)((long)in_RDI + 0xefe8); local_4c = local_4c + 1) {
    lVar2 = *(long *)((long)in_RDI + (long)local_4c * 0x78 + 0x13c60);
    HVector::clear(in_stack_ffffffffffffffc0);
    *(undefined1 *)(lVar2 + 0x80) = 1;
    HMatrix::collect_aj((HMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
  }
  return;
}

Assistant:

void HDual::major_updateFtranPrepare() {
    // Prepare FTRAN BFRT buffer
    columnBFRT.clear();
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *Fin = &multi_finish[iFn];
        HVector *Vec = Fin->columnBFRT;
        matrix->collect_aj(*Vec, Fin->columnIn, Fin->thetaPrimal);

        // Update this buffer by previous Row_ep
        for (int jFn = iFn - 1; jFn >= 0; jFn--) {
            MFinish *jFinish = &multi_finish[jFn];
            double *jRow_epArray = &jFinish->row_ep->array[0];
            double pivotX = 0;
            for (int k = 0; k < Vec->count; k++) {
                int iRow = Vec->index[k];
                pivotX += Vec->array[iRow] * jRow_epArray[iRow];
            }
            if (fabs(pivotX) > HSOL_CONST_TINY) {
                pivotX /= jFinish->alphaRow;
                matrix->collect_aj(*Vec, jFinish->columnIn, -pivotX);
                matrix->collect_aj(*Vec, jFinish->columnOut, pivotX);
            }
        }
        columnBFRT.saxpy(1, Vec);
    }

    // Prepare regular FTRAN buffer
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *iFinish = &multi_finish[iFn];
        HVector *iColumn = iFinish->column;
        iColumn->clear();
        iColumn->packFlag = true;
        matrix->collect_aj(*iColumn, iFinish->columnIn, 1);
    }

}